

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

string * cxxflags_abi_cxx11_(string *__return_storage_ptr__,bool internal)

{
  size_type sVar1;
  int iVar2;
  char *__rhs;
  undefined7 in_register_00000031;
  long lVar3;
  string cxx_version;
  string compiler;
  undefined1 local_2a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_260 [4];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000031,internal) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (cxxflags[abi:cxx11](bool)::flags_abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&cxxflags[abi:cxx11](bool)::flags_abi_cxx11_);
      if (iVar2 != 0) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[7],_const_char_(&)[11],_true>
                  (local_260,(char (*) [7])"msvc14",(char (*) [11])"/std:c++14");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                  (local_260 + 1,(char (*) [8])"clang14",(char (*) [11])"-std=c++1y");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[6],_const_char_(&)[11],_true>
                  (local_260 + 2,(char (*) [6])"gcc14",(char (*) [11])"-std=c++1y");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[7],_const_char_(&)[11],_true>
                  (local_260 + 3,(char (*) [7])"msvc17",(char (*) [11])"/std:c++17");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                  (&local_160,(char (*) [8])"clang17",(char (*) [11])"-std=c++1z");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[6],_const_char_(&)[11],_true>
                  (&local_120,(char (*) [6])"gcc17",(char (*) [11])"-std=c++1z");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[7],_const_char_(&)[15],_true>
                  (&local_e0,(char (*) [7])"msvc20",(char (*) [15])"/std:c++latest");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                  (&local_a0,(char (*) [8])"clang20",(char (*) [11])"-std=c++2a");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[6],_const_char_(&)[11],_true>
                  (&local_60,(char (*) [6])"gcc20",(char (*) [11])"-std=c++2a");
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&cxxflags[abi:cxx11](bool)::flags_abi_cxx11_,local_260,
                   &stack0xffffffffffffffe0,0,&local_2a0,&local_280,&local_2a1);
        lVar3 = 0x200;
        do {
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)((long)&local_260[0].first._M_dataplus._M_p + lVar3));
          lVar3 = lVar3 + -0x40;
        } while (lVar3 != -0x40);
        __cxa_atexit(std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::~unordered_map,&cxxflags[abi:cxx11](bool)::flags_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&cxxflags[abi:cxx11](bool)::flags_abi_cxx11_);
      }
    }
    std::__cxx11::string::string((string *)local_260,"",(allocator *)&local_2a0);
    std::__cxx11::string::assign((char *)local_260);
    std::__cxx11::string::string((string *)&local_2a0,"",(allocator *)&local_280);
    std::__cxx11::string::assign((char *)&local_2a0);
    std::operator+(&local_280,&local_260[0].first,&local_2a0);
    std::__detail::
    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&cxxflags[abi:cxx11](bool)::flags_abi_cxx11_,&local_280);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)local_260);
  }
  __rhs = getenv("CXXFLAGS");
  if (__rhs != (char *)0x0) {
    sVar1 = __return_storage_ptr__->_M_string_length;
    if (sVar1 == 0) {
      std::__cxx11::string::string((string *)local_260,__rhs,(allocator *)&local_2a0);
    }
    else {
      std::__cxx11::string::string((string *)&local_2a0," ",(allocator *)&local_280);
      std::operator+(&local_260[0].first,&local_2a0,__rhs);
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)local_260);
    if (sVar1 != 0) {
      std::__cxx11::string::~string((string *)&local_2a0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cxxflags(bool internal = false) {
  std::string cppflags;

  if (internal) {
    cppflags += "-I../include -I../../include ";  // bjam, cmake
    static std::unordered_map<std::string, std::string> flags = {
        {"msvc14", "/std:c++14"},     {"clang14", "-std=c++1y"}, {"gcc14", "-std=c++1y"},
        {"msvc17", "/std:c++17"},     {"clang17", "-std=c++1z"}, {"gcc17", "-std=c++1z"},
        {"msvc20", "/std:c++latest"}, {"clang20", "-std=c++2a"}, {"gcc20", "-std=c++2a"}};

    std::string compiler = "";
#if defined(__CLANG__)
    compiler = "clang";
#elif defined(__GCC__)
    compiler = "gcc";
#elif defined(__MSVC__)
    compiler = "msvc";
#endif

    std::string cxx_version = "";
#if __cplusplus <= 201402L
    cxx_version = "14";
#elif __cplusplus == 201703L
    cxx_version = "17";
#elif __cplusplus >= 201704L
    cxx_version = "20";
#endif
    cppflags += flags[compiler + cxx_version];
  }

  if (auto flags = std::getenv("CXXFLAGS")) {
    cppflags += cppflags.empty() ? flags : std::string{" "} + flags;
  }

  return cppflags;
}